

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,_testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  const_iterator cVar13;
  CodeLocation *pCVar14;
  long *plVar15;
  size_t sVar16;
  TestFactoryBase *pTVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong *puVar18;
  long *plVar19;
  size_type *psVar20;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *extraout_RDX_10;
  type_info *extraout_RDX_11;
  type_info *extraout_RDX_12;
  type_info *extraout_RDX_13;
  type_info *extraout_RDX_14;
  type_info *ptVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  ulong uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  char *pcVar24;
  char *pcVar25;
  CodeLocation *pCVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  _Alloc_hider _Var28;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  CodeLocation local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  GTestLog local_36c;
  string local_368;
  int local_348;
  string local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  uint local_300;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2b8;
  string local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  uint local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  CodeLocation *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  int local_220;
  TypedTestSuitePState *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  string local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  long local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  CodeLocation *local_118;
  size_type local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  key_type local_d0;
  key_type local_b0;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_218 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
  pcVar12 = strchr((char *)code_location,0x2c);
  if (pcVar12 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,(char *)code_location,(allocator<char> *)&local_3b8);
  }
  else {
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,code_location,pcVar12);
  }
  local_d0._M_dataplus._M_p = (pointer)local_158;
  local_248 = code_location;
  if (local_150 != 0) {
    pcVar12 = local_158->_M_local_buf + local_150;
    do {
      paVar27 = local_158;
      iVar11 = isspace((uint)(byte)pcVar12[-1]);
      local_d0._M_dataplus._M_p = (pointer)paVar27;
      if (iVar11 == 0) break;
      pcVar24 = pcVar12 + -1;
      uVar22 = (long)pcVar24 - (long)paVar27;
      std::__cxx11::string::_M_erase((ulong)&local_158,uVar22);
      pcVar12 = local_158->_M_local_buf + uVar22;
      local_d0._M_dataplus._M_p = (pointer)local_158;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar24 != paVar27);
  }
  local_158 = &local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == local_158) {
    local_d0.field_2._8_8_ = local_148._8_8_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  local_d0.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_d0.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_d0._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                   *)(bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ + 8
                     ),&local_d0);
  iVar11 = 0x6e17a8;
  if (cVar13._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ + 0x10)
     ) {
    FormatFileLocation_abi_cxx11_
              (&local_3b8.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6e17a8
              );
    TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
    ::Register();
LAB_002ccd39:
    FormatFileLocation_abi_cxx11_
              (&local_3b8.file,(internal *)local_180->_M_local_buf,(char *)(ulong)local_160,iVar11);
    TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
    ::Register();
  }
  else {
    pCVar14 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                         &local_d0);
    local_1a8 = &local_198;
    pcVar2 = (pCVar14->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + (pCVar14->file)._M_string_length);
    local_188 = pCVar14->line;
    local_290 = &local_280;
    local_280._M_local_buf[0] = 'P';
    local_280._M_allocated_capacity._1_6_ = 0x697542687461;
    local_280._7_4_ = 0x7265646c;
    local_288 = 0xb;
    local_280._M_local_buf[0xb] = '\0';
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_290);
    pCVar14 = local_248;
    local_240 = &local_230;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      local_230._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_230._8_8_ = plVar15[3];
    }
    else {
      local_230._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_238 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_320 = &local_310;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_310._8_8_ = plVar15[3];
    }
    else {
      local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_318 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_320);
    local_2d8 = &local_2c8;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      local_2c8._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_2c8._8_8_ = plVar15[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_2d0 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_2d8,**(ulong **)local_218);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    puVar18 = (ulong *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_368.field_2._M_allocated_capacity = *puVar18;
      local_368.field_2._8_8_ = plVar15[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *puVar18;
      local_368._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_368._M_string_length = plVar15[1];
    *plVar15 = (long)puVar18;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    pcVar12 = strchr((char *)pCVar14,0x2c);
    if (pcVar12 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,(char *)pCVar14,(allocator<char> *)&local_340);
      ptVar21 = extraout_RDX_00;
    }
    else {
      local_390 = &local_380;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,pCVar14,pcVar12);
      ptVar21 = extraout_RDX;
    }
    paVar27 = local_390;
    if (local_388 != 0) {
      pcVar12 = local_390->_M_local_buf + local_388;
      do {
        paVar23 = local_390;
        iVar11 = isspace((uint)(byte)pcVar12[-1]);
        ptVar21 = extraout_RDX_01;
        paVar27 = paVar23;
        if (iVar11 == 0) break;
        pcVar24 = pcVar12 + -1;
        uVar22 = (long)pcVar24 - (long)paVar23;
        std::__cxx11::string::_M_erase((ulong)&local_390,uVar22);
        pcVar12 = local_390->_M_local_buf + uVar22;
        ptVar21 = extraout_RDX_02;
        paVar27 = local_390;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar24 != paVar23);
    }
    uVar9 = local_2f8.field_2._7_4_;
    paVar23 = &local_2f8.field_2;
    local_390 = &local_380;
    local_2f8.field_2._M_local_buf[7] = (char)((ulong)local_380._0_8_ >> 0x38);
    local_2f8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_380._M_allocated_capacity;
    if (paVar27 == local_390) {
      local_2f8.field_2._8_3_ = (undefined3)local_380._8_8_;
      local_2f8.field_2._M_local_buf[0xb] = (char)((ulong)local_380._8_8_ >> 0x18);
      local_2f8.field_2._12_4_ = (undefined4)((ulong)local_380._8_8_ >> 0x20);
    }
    else {
      local_2f8.field_2._8_3_ = SUB43(uVar9,1);
      paVar23 = paVar27;
    }
    local_2f8._M_string_length = local_388;
    local_388 = 0;
    local_380._M_allocated_capacity = local_380._M_allocated_capacity & 0xffffffffffffff00;
    local_2f8._M_dataplus._M_p = (pointer)paVar23;
    GetTypeName_abi_cxx11_
              (&local_340,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
               ptVar21);
    _Var28._M_p = local_340._M_dataplus._M_p;
    local_3b8.file._M_dataplus._M_p = (pointer)&local_3b8.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b8,local_1a8,local_1a0 + (long)local_1a8);
    iVar11 = local_188;
    paVar27 = local_1a8;
    local_3b8.line = local_188;
    bVar10 = IsTrue(true);
    if (!bVar10) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar27 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar16 = strlen(paVar27->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar27->_M_local_buf,sVar16);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    iVar11 = local_188;
    paVar27 = local_1a8;
    bVar10 = IsTrue(true);
    if (!bVar10) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar27 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar16 = strlen(paVar27->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar27->_M_local_buf,sVar16);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    pTVar17 = (TestFactoryBase *)operator_new(8);
    pTVar17->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006b7600;
    MakeAndRegisterTestInfo
              (&local_368,paVar23->_M_local_buf,_Var28._M_p,(char *)0x0,&local_3b8,
               &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.file._M_dataplus._M_p != &local_3b8.file.field_2) {
      operator_delete(local_3b8.file._M_dataplus._M_p,
                      local_3b8.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT17(local_340.field_2._M_local_buf[7],
                               CONCAT61(local_340.field_2._M_allocated_capacity._1_6_,
                                        local_340.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT17(local_2f8.field_2._M_local_buf[7],
                               local_2f8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,local_380._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if (local_320 != &local_310) {
      operator_delete(local_320,local_310._M_allocated_capacity + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,
                      CONCAT17(local_280._M_local_buf[7],
                               CONCAT61(local_280._M_allocated_capacity._1_6_,
                                        local_280._M_local_buf[0])) + 1);
    }
    if (local_1a8 == &local_198) {
      local_1e0._8_8_ = local_198._8_8_;
      local_1a8 = &local_1e0;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_198._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_198._M_local_buf[0];
    local_1e8 = local_1a0;
    local_1a0 = 0;
    local_198._M_local_buf[0] = '\0';
    local_1d0 = local_188;
    pCVar14 = local_248;
    local_1f0 = local_1a8;
    paVar27 = &local_198;
    if ((local_1a8 != &local_1e0) &&
       (paVar27 = local_1a8, local_1a8 = &local_198,
       operator_delete(paVar27,local_1e0._M_allocated_capacity + 1), pCVar14 = local_248,
       paVar27 = local_1a8, local_1a8 != &local_198)) {
      operator_delete(local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
      paVar27 = local_1a8;
    }
    local_1a8 = paVar27;
    local_180 = &local_170;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(prefix + 0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)prefix == paVar27) {
      local_170._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_170._8_8_ = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_170._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_180 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)prefix;
    }
    local_178 = *(size_type *)(prefix + 8);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)prefix = paVar27;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_160 = *(uint *)(prefix + 0x20);
    pcVar12 = strchr((char *)pCVar14,0x2c);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar12 + 1);
        pcVar12 = pcVar12 + 1;
        iVar11 = isspace((uint)*pbVar1);
      } while (iVar11 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
    pcVar24 = strchr(pcVar12,0x2c);
    if (pcVar24 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pcVar12,(allocator<char> *)&local_3b8);
    }
    else {
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar12,pcVar24);
    }
    local_b0._M_dataplus._M_p = (pointer)local_138;
    if (local_130 != 0) {
      pcVar24 = local_138->_M_local_buf + local_130;
      do {
        paVar27 = local_138;
        iVar11 = isspace((uint)(byte)pcVar24[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar27;
        if (iVar11 == 0) break;
        pcVar25 = pcVar24 + -1;
        uVar22 = (long)pcVar25 - (long)paVar27;
        std::__cxx11::string::_M_erase((ulong)&local_138,uVar22);
        pcVar24 = local_138->_M_local_buf + uVar22;
        local_b0._M_dataplus._M_p = (pointer)local_138;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar25 != paVar27);
    }
    local_138 = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_138) {
      local_b0.field_2._8_8_ = local_128._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_128._M_local_buf[0];
    local_b0._M_string_length = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ +
                       8),&local_b0);
    iVar11 = 0x6e17a8;
    if (cVar13._M_node ==
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ + 0x10))
    goto LAB_002ccd39;
    pCVar14 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                         &local_b0);
    local_240 = &local_230;
    pcVar2 = (pCVar14->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar2,pcVar2 + (pCVar14->file)._M_string_length);
    local_220 = pCVar14->line;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    local_2f8.field_2._M_allocated_capacity._0_7_ = 0x69754268746150;
    local_2f8.field_2._7_4_ = 0x7265646c;
    local_2f8._M_string_length = 0xb;
    local_2f8.field_2._M_local_buf[0xb] = '\0';
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_290 = &local_280;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      sVar3 = paVar27->_M_allocated_capacity;
      lVar4 = plVar15[3];
      local_280._M_local_buf[0] = (char)sVar3;
      local_280._M_allocated_capacity._1_6_ = (undefined6)(sVar3 >> 8);
      local_280._M_local_buf[7] = (char)(sVar3 >> 0x38);
      local_280._8_3_ = (undefined3)lVar4;
      local_280._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
      local_280._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    }
    else {
      sVar3 = paVar27->_M_allocated_capacity;
      local_280._M_local_buf[0] = (char)sVar3;
      local_280._M_allocated_capacity._1_6_ = (undefined6)(sVar3 >> 8);
      local_280._M_local_buf[7] = (char)(sVar3 >> 0x38);
      local_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_288 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_320 = &local_310;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_310._8_8_ = plVar15[3];
    }
    else {
      local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_318 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_320);
    local_2d8 = &local_2c8;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar27) {
      local_2c8._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_2c8._8_8_ = plVar15[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15;
    }
    local_2d0 = plVar15[1];
    *plVar15 = (long)paVar27;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_2d8,**(ulong **)local_218);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    puVar18 = (ulong *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_368.field_2._M_allocated_capacity = *puVar18;
      local_368.field_2._8_8_ = plVar15[3];
    }
    else {
      local_368.field_2._M_allocated_capacity = *puVar18;
      local_368._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_368._M_string_length = plVar15[1];
    *plVar15 = (long)puVar18;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    pcVar24 = strchr(pcVar12,0x2c);
    if (pcVar24 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,pcVar12,(allocator<char> *)&local_2b0);
      ptVar21 = extraout_RDX_04;
    }
    else {
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,pcVar12,pcVar24);
      ptVar21 = extraout_RDX_03;
    }
    _Var28._M_p = local_340._M_dataplus._M_p;
    if (local_340._M_string_length != 0) {
      pcVar24 = local_340._M_dataplus._M_p + local_340._M_string_length;
      do {
        _Var8._M_p = local_340._M_dataplus._M_p;
        iVar11 = isspace((uint)(byte)pcVar24[-1]);
        ptVar21 = extraout_RDX_05;
        _Var28._M_p = _Var8._M_p;
        if (iVar11 == 0) break;
        pcVar25 = pcVar24 + -1;
        uVar22 = (long)pcVar25 - (long)_Var8._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_340,uVar22);
        pcVar24 = local_340._M_dataplus._M_p + uVar22;
        ptVar21 = extraout_RDX_06;
        _Var28._M_p = local_340._M_dataplus._M_p;
      } while (pcVar25 != _Var8._M_p);
    }
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    if (_Var28._M_p == local_340._M_dataplus._M_p) {
      local_380._8_8_ =
           CONCAT44(local_340.field_2._12_4_,
                    CONCAT13(local_340.field_2._M_local_buf[0xb],local_340.field_2._8_3_));
      _Var28._M_p = (pointer)&local_380;
    }
    local_380._M_allocated_capacity._1_6_ = local_340.field_2._M_allocated_capacity._1_6_;
    local_380._M_local_buf[0] = local_340.field_2._M_local_buf[0];
    local_380._M_local_buf[7] = local_340.field_2._M_local_buf[7];
    local_388 = local_340._M_string_length;
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var28._M_p;
    GetTypeName_abi_cxx11_
              (&local_2b0,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
               ptVar21);
    _Var8._M_p = local_2b0._M_dataplus._M_p;
    local_3b8.file._M_dataplus._M_p = (pointer)&local_3b8.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b8,local_240,local_238 + (long)local_240);
    iVar11 = local_220;
    paVar27 = local_240;
    local_3b8.line = local_220;
    bVar10 = IsTrue(true);
    if (!bVar10) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar27 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar16 = strlen(paVar27->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar27->_M_local_buf,sVar16);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    iVar11 = local_220;
    paVar27 = local_240;
    bVar10 = IsTrue(true);
    if (!bVar10) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar27 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar16 = strlen(paVar27->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar27->_M_local_buf,sVar16);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    pTVar17 = (TestFactoryBase *)operator_new(8);
    pTVar17->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006b76d8;
    MakeAndRegisterTestInfo
              (&local_368,_Var28._M_p,_Var8._M_p,(char *)0x0,&local_3b8,
               &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar17);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.file._M_dataplus._M_p != &local_3b8.file.field_2) {
      operator_delete(local_3b8.file._M_dataplus._M_p,
                      local_3b8.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,local_380._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      CONCAT17(local_340.field_2._M_local_buf[7],
                               CONCAT61(local_340.field_2._M_allocated_capacity._1_6_,
                                        local_340.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if (local_320 != &local_310) {
      operator_delete(local_320,local_310._M_allocated_capacity + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,
                      CONCAT17(local_280._M_local_buf[7],
                               CONCAT61(local_280._M_allocated_capacity._1_6_,
                                        local_280._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT17(local_2f8.field_2._M_local_buf[7],
                               local_2f8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    uVar7 = local_230._M_allocated_capacity;
    if (local_240 == &local_230) {
      local_1e0._8_8_ = local_230._8_8_;
      local_240 = &local_1e0;
    }
    local_1e0._M_allocated_capacity = local_230._M_allocated_capacity;
    local_1e8 = local_238;
    local_238 = 0;
    local_230._M_allocated_capacity = local_230._M_allocated_capacity & 0xffffffffffffff00;
    local_1d0 = local_220;
    paVar27 = &local_230;
    local_1f0 = local_240;
    if ((local_240 != &local_1e0) &&
       (local_240 = &local_230, operator_delete(local_1f0,uVar7 + 1), paVar27 = local_240,
       local_240 != &local_230)) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
      paVar27 = local_240;
    }
    local_240 = paVar27;
    uVar9 = local_280._7_4_;
    local_290 = &local_280;
    local_280._M_local_buf[0] = (char)local_170._M_allocated_capacity;
    local_280._M_local_buf[7] = (char)((ulong)local_170._0_8_ >> 0x38);
    local_280._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_170._0_8_ >> 8);
    if (local_180 == &local_170) {
      local_280._8_3_ = (undefined3)local_170._8_8_;
      local_280._M_local_buf[0xb] = (char)((ulong)local_170._8_8_ >> 0x18);
      local_280._12_4_ = (undefined4)((ulong)local_170._8_8_ >> 0x20);
    }
    else {
      local_290 = local_180;
      local_280._8_3_ = SUB43(uVar9,1);
    }
    local_288 = local_178;
    local_178 = 0;
    local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
    local_270 = local_160;
    local_180 = &local_170;
    pcVar12 = strchr(pcVar12,0x2c);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar12 + 1);
        pcVar12 = pcVar12 + 1;
        iVar11 = isspace((uint)*pbVar1);
      } while (iVar11 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
    pcVar24 = strchr(pcVar12,0x2c);
    if (pcVar24 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,pcVar12,(allocator<char> *)&local_3b8);
    }
    else {
      local_118 = (CodeLocation *)local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar12,pcVar24);
    }
    local_90._0_8_ = local_118;
    if (local_110 != 0) {
      pcVar24 = (char *)((long)&(local_118->file)._M_dataplus._M_p + local_110);
      do {
        pCVar14 = local_118;
        iVar11 = isspace((uint)(byte)pcVar24[-1]);
        local_90._0_8_ = pCVar14;
        if (iVar11 == 0) break;
        pCVar26 = (CodeLocation *)(pcVar24 + -1);
        uVar22 = (long)pCVar26 - (long)pCVar14;
        std::__cxx11::string::_M_erase((ulong)&local_118,uVar22);
        pcVar24 = (char *)(uVar22 + (long)local_118);
        local_90._0_8_ = local_118;
      } while (pCVar26 != pCVar14);
    }
    local_248 = (CodeLocation *)(local_90 + 0x10);
    local_118 = (CodeLocation *)local_108;
    if ((CodeLocation *)local_90._0_8_ == local_118) {
      uStack_78 = local_108._8_8_;
      local_90._0_8_ = local_248;
    }
    uStack_7f = local_108._1_7_;
    local_90[0x10] = local_108[0];
    local_90._8_8_ = local_110;
    local_110 = 0;
    local_108[0] = 0;
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ +
                       8),(key_type *)local_90);
    iVar11 = 0x6e17a8;
    if (cVar13._M_node !=
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ + 0x10)) {
      pCVar14 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::
                           gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                           (string *)local_90);
      local_2d8 = &local_2c8;
      pcVar2 = (pCVar14->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,pcVar2,pcVar2 + (pCVar14->file)._M_string_length);
      local_2b8 = pCVar14->line;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      local_340.field_2._M_local_buf[0] = 'P';
      local_340.field_2._M_allocated_capacity._1_6_ = 0x697542687461;
      local_340.field_2._7_4_ = 0x7265646c;
      local_340._M_string_length = 0xb;
      local_340.field_2._M_local_buf[0xb] = '\0';
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_390 = &local_380;
      puVar18 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_380._M_allocated_capacity = *puVar18;
        local_380._8_8_ = plVar15[3];
      }
      else {
        local_380._M_allocated_capacity = *puVar18;
        local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15;
      }
      local_388 = plVar15[1];
      *plVar15 = (long)puVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_390);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      plVar19 = plVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar19) {
        lVar4 = plVar15[3];
        local_2f8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar19;
        local_2f8.field_2._M_local_buf[7] = (char)((ulong)*plVar19 >> 0x38);
        local_2f8.field_2._8_3_ = (undefined3)lVar4;
        local_2f8.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2f8.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
      else {
        local_2f8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar19;
        local_2f8.field_2._M_local_buf[7] = (char)((ulong)*plVar19 >> 0x38);
        local_2f8._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_2f8._M_string_length = plVar15[1];
      *plVar15 = (long)plVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_320 = &local_310;
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar27) {
        local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
        local_310._8_8_ = plVar15[3];
      }
      else {
        local_310._M_allocated_capacity = paVar27->_M_allocated_capacity;
        local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15;
      }
      local_318 = plVar15[1];
      *plVar15 = (long)paVar27;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_320,**(ulong **)local_218);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      puVar18 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_368.field_2._M_allocated_capacity = *puVar18;
        local_368.field_2._8_8_ = plVar15[3];
      }
      else {
        local_368.field_2._M_allocated_capacity = *puVar18;
        local_368._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_368._M_string_length = plVar15[1];
      *plVar15 = (long)puVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      pcVar24 = strchr(pcVar12,0x2c);
      if (pcVar24 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,pcVar12,(allocator<char> *)&local_1c8);
        ptVar21 = extraout_RDX_08;
      }
      else {
        local_268 = &local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,pcVar12,pcVar24);
        ptVar21 = extraout_RDX_07;
      }
      paVar27 = local_268;
      if (local_260 != 0) {
        pcVar24 = local_268->_M_local_buf + local_260;
        do {
          paVar23 = local_268;
          iVar11 = isspace((uint)(byte)pcVar24[-1]);
          ptVar21 = extraout_RDX_09;
          paVar27 = paVar23;
          if (iVar11 == 0) break;
          pcVar25 = pcVar24 + -1;
          uVar22 = (long)pcVar25 - (long)paVar23;
          std::__cxx11::string::_M_erase((ulong)&local_268,uVar22);
          pcVar24 = local_268->_M_local_buf + uVar22;
          ptVar21 = extraout_RDX_10;
          paVar27 = local_268;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar25 != paVar23);
      }
      local_268 = &local_258;
      if (paVar27 == local_268) {
        local_2b0.field_2._8_8_ =
             CONCAT44(local_258._12_4_,CONCAT13(local_258._M_local_buf[0xb],local_258._8_3_));
        paVar27 = &local_2b0.field_2;
      }
      local_2b0.field_2._M_allocated_capacity._1_6_ = local_258._M_allocated_capacity._1_6_;
      local_2b0.field_2._M_local_buf[0] = local_258._M_local_buf[0];
      local_2b0.field_2._M_local_buf[7] = local_258._M_local_buf[7];
      local_2b0._M_string_length = local_260;
      local_260 = 0;
      local_258._M_local_buf[0] = '\0';
      local_2b0._M_dataplus._M_p = (pointer)paVar27;
      GetTypeName_abi_cxx11_
                (&local_1c8,
                 (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
                 ptVar21);
      _Var28._M_p = local_1c8._M_dataplus._M_p;
      local_3b8.file._M_dataplus._M_p = (pointer)&local_3b8.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b8,local_2d8,local_2d0 + (long)local_2d8);
      iVar11 = local_2b8;
      paVar23 = local_2d8;
      local_3b8.line = local_2b8;
      bVar10 = IsTrue(true);
      if (!bVar10) {
        GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar16 = strlen(paVar23->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar16);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar11);
        GTestLog::~GTestLog((GTestLog *)&local_210);
      }
      iVar11 = local_2b8;
      paVar23 = local_2d8;
      bVar10 = IsTrue(true);
      if (!bVar10) {
        GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar16 = strlen(paVar23->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar23->_M_local_buf,sVar16);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar11);
        GTestLog::~GTestLog((GTestLog *)&local_210);
      }
      pTVar17 = (TestFactoryBase *)operator_new(8);
      pTVar17->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006b7788;
      MakeAndRegisterTestInfo
                (&local_368,paVar27->_M_local_buf,_Var28._M_p,(char *)0x0,&local_3b8,
                 &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.file._M_dataplus._M_p != &local_3b8.file.field_2) {
        operator_delete(local_3b8.file._M_dataplus._M_p,
                        local_3b8.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,
                        CONCAT17(local_258._M_local_buf[7],
                                 CONCAT61(local_258._M_allocated_capacity._1_6_,
                                          local_258._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        CONCAT17(local_2f8.field_2._M_local_buf[7],
                                 local_2f8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT17(local_340.field_2._M_local_buf[7],
                                 CONCAT61(local_340.field_2._M_allocated_capacity._1_6_,
                                          local_340.field_2._M_local_buf[0])) + 1);
      }
      uVar7 = local_2c8._M_allocated_capacity;
      if (local_2d8 == &local_2c8) {
        local_1e0._8_8_ = local_2c8._8_8_;
        local_2d8 = &local_1e0;
      }
      local_1e0._M_allocated_capacity = local_2c8._M_allocated_capacity;
      local_1e8 = local_2d0;
      local_2d0 = 0;
      local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
      local_1d0 = local_2b8;
      paVar27 = &local_2c8;
      local_1f0 = local_2d8;
      if ((local_2d8 != &local_1e0) &&
         (local_2d8 = &local_2c8, operator_delete(local_1f0,uVar7 + 1), paVar27 = local_2d8,
         local_2d8 != &local_2c8)) {
        operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
        paVar27 = local_2d8;
      }
      local_2d8 = paVar27;
      local_320 = &local_310;
      if (local_290 == &local_280) {
        local_310._8_8_ =
             CONCAT44(local_280._12_4_,CONCAT13(local_280._M_local_buf[0xb],local_280._8_3_));
      }
      else {
        local_320 = local_290;
      }
      local_310._M_allocated_capacity._1_6_ = local_280._M_allocated_capacity._1_6_;
      local_310._M_local_buf[0] = local_280._M_local_buf[0];
      local_310._M_local_buf[7] = local_280._M_local_buf[7];
      local_318 = local_288;
      local_288 = 0;
      local_280._M_local_buf[0] = '\0';
      local_300 = local_270;
      local_290 = &local_280;
      pcVar12 = strchr(pcVar12,0x2c);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar12 + 1);
          pcVar12 = pcVar12 + 1;
          iVar11 = isspace((uint)*pbVar1);
        } while (iVar11 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
      pcVar24 = strchr(pcVar12,0x2c);
      if (pcVar24 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_108 + 0x10),pcVar12,(allocator<char> *)&local_3b8);
      }
      else {
        local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_108 + 0x10),pcVar12,pcVar24);
      }
      local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
      if (local_f8._8_8_ != 0) {
        pcVar24 = (char *)(local_f8._8_8_ + local_f8._M_allocated_capacity);
        do {
          uVar7 = local_f8._M_allocated_capacity;
          iVar11 = isspace((uint)(byte)pcVar24[-1]);
          local_70._M_allocated_capacity = uVar7;
          if (iVar11 == 0) break;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar24 + -1);
          uVar22 = (long)paVar27 - uVar7;
          std::__cxx11::string::_M_erase((ulong)(local_108 + 0x10),uVar22);
          pcVar24 = (char *)(uVar22 + local_f8._M_allocated_capacity);
          local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
        } while (paVar27 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar7);
      }
      local_d8 = &local_60;
      local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
      if (local_70._M_allocated_capacity == local_f8._M_allocated_capacity) {
        local_60._8_8_ = local_e8._8_8_;
        local_70._M_allocated_capacity = (size_type)local_d8;
      }
      local_60._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_60._M_local_buf[0] = local_e8._M_local_buf[0];
      local_70._8_8_ = local_f8._8_8_;
      local_f8._8_8_ = 0;
      local_e8._M_local_buf[0] = 0;
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                       *)(bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_
                         + 8),(key_type *)&local_70);
      iVar11 = 0x6e17a8;
      if (cVar13._M_node !=
          (_Base_ptr)
          (bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_ + 0x10)) {
        pCVar14 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::
                             gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                             (string *)&local_70);
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        pcVar2 = (pCVar14->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,pcVar2,pcVar2 + (pCVar14->file)._M_string_length);
        local_348 = pCVar14->line;
        local_268 = &local_258;
        local_258._M_local_buf[0] = 'P';
        local_258._M_allocated_capacity._1_6_ = 0x697542687461;
        local_258._7_4_ = 0x7265646c;
        local_260 = 0xb;
        local_258._M_local_buf[0xb] = '\0';
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_268);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        psVar20 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_2b0.field_2._M_allocated_capacity = *psVar20;
          local_2b0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar20;
          local_2b0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_2b0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        plVar19 = plVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar19) {
          lVar4 = *plVar19;
          lVar5 = plVar15[3];
          local_340.field_2._M_local_buf[0] = (char)lVar4;
          local_340.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar4 >> 8);
          local_340.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
          local_340.field_2._8_3_ = (undefined3)lVar5;
          local_340.field_2._M_local_buf[0xb] = (char)((ulong)lVar5 >> 0x18);
          local_340.field_2._12_4_ = (undefined4)((ulong)lVar5 >> 0x20);
        }
        else {
          lVar4 = *plVar19;
          local_340.field_2._M_local_buf[0] = (char)lVar4;
          local_340.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar4 >> 8);
          local_340.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
          local_340._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_340._M_string_length = plVar15[1];
        *plVar15 = (long)plVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_390 = &local_380;
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar27) {
          local_380._M_allocated_capacity = paVar27->_M_allocated_capacity;
          local_380._8_8_ = plVar15[3];
        }
        else {
          local_380._M_allocated_capacity = paVar27->_M_allocated_capacity;
          local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15;
        }
        local_388 = plVar15[1];
        *plVar15 = (long)paVar27;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_390,**(ulong **)local_218);
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        plVar19 = plVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar19) {
          lVar4 = plVar15[3];
          local_2f8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar19;
          local_2f8.field_2._M_local_buf[7] = (char)((ulong)*plVar19 >> 0x38);
          local_2f8.field_2._8_3_ = (undefined3)lVar4;
          local_2f8.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
          local_2f8.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
        }
        else {
          local_2f8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar19;
          local_2f8.field_2._M_local_buf[7] = (char)((ulong)*plVar19 >> 0x38);
          local_2f8._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_2f8._M_string_length = plVar15[1];
        *plVar15 = (long)plVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        pcVar24 = strchr(pcVar12,0x2c);
        if (pcVar24 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,pcVar12,(allocator<char> *)&local_50);
          ptVar21 = extraout_RDX_12;
        }
        else {
          local_210 = &local_200;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pcVar12,pcVar24);
          ptVar21 = extraout_RDX_11;
        }
        paVar27 = local_210;
        if (local_208 != 0) {
          pcVar24 = local_210->_M_local_buf + local_208;
          do {
            paVar23 = local_210;
            iVar11 = isspace((uint)(byte)pcVar24[-1]);
            ptVar21 = extraout_RDX_13;
            paVar27 = paVar23;
            if (iVar11 == 0) break;
            pcVar25 = pcVar24 + -1;
            uVar22 = (long)pcVar25 - (long)paVar23;
            std::__cxx11::string::_M_erase((ulong)&local_210,uVar22);
            pcVar24 = local_210->_M_local_buf + uVar22;
            ptVar21 = extraout_RDX_14;
            paVar27 = local_210;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar25 != paVar23);
        }
        local_210 = &local_200;
        if (paVar27 == local_210) {
          local_1c8.field_2._8_8_ = local_200._8_8_;
          paVar27 = &local_1c8.field_2;
        }
        local_1c8.field_2._M_allocated_capacity._1_7_ = local_200._M_allocated_capacity._1_7_;
        local_1c8.field_2._M_local_buf[0] = local_200._M_local_buf[0];
        local_1c8._M_string_length = local_208;
        local_208 = 0;
        local_200._M_local_buf[0] = '\0';
        local_1c8._M_dataplus._M_p = (pointer)paVar27;
        GetTypeName_abi_cxx11_
                  (&local_50,
                   (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
                   ptVar21);
        _Var8._M_p = local_50._M_dataplus._M_p;
        local_3b8.file._M_dataplus._M_p = (pointer)&local_3b8.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_368._M_dataplus._M_p,
                   local_368._M_dataplus._M_p + local_368._M_string_length);
        iVar11 = local_348;
        _Var28._M_p = local_368._M_dataplus._M_p;
        local_3b8.line = local_348;
        bVar10 = IsTrue(true);
        if (!bVar10) {
          GTestLog::GTestLog(&local_36c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var28._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar16 = strlen(_Var28._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var28._M_p,sVar16);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar11);
          GTestLog::~GTestLog(&local_36c);
        }
        iVar11 = local_348;
        _Var28._M_p = local_368._M_dataplus._M_p;
        bVar10 = IsTrue(true);
        if (!bVar10) {
          GTestLog::GTestLog(&local_36c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var28._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar16 = strlen(_Var28._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var28._M_p,sVar16);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar11);
          GTestLog::~GTestLog(&local_36c);
        }
        pTVar17 = (TestFactoryBase *)operator_new(8);
        pTVar17->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006b7838;
        type_names_00 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                 ::dummy_;
        pCVar14 = &local_3b8;
        MakeAndRegisterTestInfo
                  (&local_2f8,paVar27->_M_local_buf,_Var8._M_p,(char *)0x0,pCVar14,
                   &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar17);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.file._M_dataplus._M_p != &local_3b8.file.field_2) {
          operator_delete(local_3b8.file._M_dataplus._M_p,
                          local_3b8.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,
                          CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,
                          CONCAT17(local_2f8.field_2._M_local_buf[7],
                                   local_2f8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (local_390 != &local_380) {
          operator_delete(local_390,local_380._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,
                          CONCAT17(local_340.field_2._M_local_buf[7],
                                   CONCAT61(local_340.field_2._M_allocated_capacity._1_6_,
                                            local_340.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,
                          CONCAT17(local_258._M_local_buf[7],
                                   CONCAT61(local_258._M_allocated_capacity._1_6_,
                                            local_258._M_local_buf[0])) + 1);
        }
        uVar7 = local_368.field_2._M_allocated_capacity;
        paVar27 = &local_368.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p == paVar27) {
          local_1e0._8_8_ = local_368.field_2._8_8_;
          local_368._M_dataplus._M_p = (pointer)&local_1e0;
        }
        local_1e0._M_allocated_capacity = local_368.field_2._M_allocated_capacity;
        local_1e8 = local_368._M_string_length;
        local_368._M_string_length = 0;
        local_368.field_2._M_allocated_capacity =
             local_368.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1d0 = local_348;
        _Var28._M_p = (pointer)paVar27;
        local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_dataplus._M_p;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_368._M_dataplus._M_p != &local_1e0) &&
           (local_368._M_dataplus._M_p = (pointer)paVar27, operator_delete(local_1f0,uVar7 + 1),
           _Var28._M_p = local_368._M_dataplus._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_368._M_dataplus._M_p != paVar27)) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          _Var28._M_p = local_368._M_dataplus._M_p;
        }
        local_368._M_dataplus._M_p = _Var28._M_p;
        local_3b8.file._M_dataplus._M_p = (pointer)&local_3b8.file.field_2;
        paVar27 = &local_310;
        if (local_320 == paVar27) {
          local_3b8.file.field_2._8_8_ = local_310._8_8_;
        }
        else {
          local_3b8.file._M_dataplus._M_p = (pointer)local_320;
        }
        local_3b8.file.field_2._M_allocated_capacity = local_310._M_allocated_capacity;
        local_3b8.file._M_string_length = local_318;
        local_318 = 0;
        local_310._M_allocated_capacity = local_310._M_allocated_capacity & 0xffffffffffffff00;
        local_3b8.line = local_300;
        local_320 = paVar27;
        pCVar26 = (CodeLocation *)strchr(pcVar12,0x2c);
        if (pCVar26 == (CodeLocation *)0x0) {
          pCVar26 = (CodeLocation *)0x0;
        }
        else {
          do {
            psVar6 = &pCVar26->file;
            pCVar26 = (CodeLocation *)((long)&(pCVar26->file)._M_dataplus._M_p + 1);
            iVar11 = isspace((uint)*(byte *)((long)&(psVar6->_M_dataplus)._M_p + 1));
          } while (iVar11 != 0);
        }
        TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,_testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>_>
        ::Register((char *)&local_3b8,pCVar26,local_218,paVar27->_M_local_buf,(char *)pCVar14,
                   type_names_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.file._M_dataplus._M_p != &local_3b8.file.field_2) {
          operator_delete(local_3b8.file._M_dataplus._M_p,
                          local_3b8.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if (local_320 != &local_310) {
          operator_delete(local_320,local_310._M_allocated_capacity + 1);
        }
        if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,
                          CONCAT17(local_280._M_local_buf[7],
                                   CONCAT61(local_280._M_allocated_capacity._1_6_,
                                            local_280._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170._M_allocated_capacity + 1);
        }
        paVar27 = &local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar27) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          paVar27 = extraout_RAX;
        }
        return SUB81(paVar27,0);
      }
      goto LAB_002ccdaf;
    }
  }
  FormatFileLocation_abi_cxx11_
            (&local_3b8.file,(internal *)local_290->_M_local_buf,(char *)(ulong)local_270,iVar11);
  TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
  ::Register();
LAB_002ccdaf:
  FormatFileLocation_abi_cxx11_
            (&local_3b8.file,(internal *)local_320->_M_local_buf,(char *)(ulong)local_300,iVar11);
  TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_d8->_M_allocated_capacity + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310._M_allocated_capacity + 1);
  }
  if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)((local_248->file)._M_dataplus._M_p + 1));
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,
                    CONCAT17(local_280._M_local_buf[7],
                             CONCAT61(local_280._M_allocated_capacity._1_6_,
                                      local_280._M_local_buf[0])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }